

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void licm_add_loop_preheaders(gen_ctx_t gen_ctx,loop_node_t_conflict loop)

{
  bool bVar1;
  int iVar2;
  edge_t_conflict e_00;
  bb_insn_t_conflict pbVar3;
  loop_node_t_conflict local_38;
  loop_node_t_conflict node;
  edge_t_conflict e;
  bb_insn_t_conflict bb_insn;
  int subloop_p;
  loop_node_t_conflict loop_local;
  gen_ctx_t gen_ctx_local;
  
  bVar1 = false;
  for (local_38 = DLIST_loop_node_t_head(&loop->children); local_38 != (loop_node_t_conflict)0x0;
      local_38 = DLIST_loop_node_t_next(local_38)) {
    if (local_38->bb == (bb_t)0x0) {
      bVar1 = true;
      licm_add_loop_preheaders(gen_ctx,local_38);
    }
  }
  if ((!bVar1) && (loop != gen_ctx->curr_cfg->root_loop_node)) {
    (loop->u).preheader = (loop_node_t)0x0;
    e_00 = find_loop_entry_edge(loop->entry->bb);
    if (e_00 != (edge_t_conflict)0x0) {
      pbVar3 = DLIST_bb_insn_t_tail(&e_00->src->bb_insns);
      if (((pbVar3 == (bb_insn_t_conflict)0x0) ||
          ((int)*(undefined8 *)&pbVar3->insn->field_0x18 == 0x76)) ||
         (iVar2 = MIR_any_branch_code_p((MIR_insn_code_t)*(undefined8 *)&pbVar3->insn->field_0x18),
         iVar2 == 0)) {
        loop->u = (anon_union_8_2_35464522_for_u)e_00->src->loop_node;
        (e_00->src->loop_node->u).preheader = loop;
      }
      else {
        create_preheader_from_edge(gen_ctx,e_00,loop);
      }
    }
  }
  return;
}

Assistant:

static void licm_add_loop_preheaders (gen_ctx_t gen_ctx, loop_node_t loop) {
  int subloop_p = FALSE;
  bb_insn_t bb_insn;
  edge_t e;

  for (loop_node_t node = DLIST_HEAD (loop_node_t, loop->children); node != NULL;
       node = DLIST_NEXT (loop_node_t, node))
    if (node->bb == NULL) {
      subloop_p = TRUE;
      licm_add_loop_preheaders (gen_ctx, node); /* process sub-loops */
    }
  /* See loop_licm where we process only the nested loops: */
  if (subloop_p || loop == curr_cfg->root_loop_node) return;
  loop->u.preheader = NULL;
  if ((e = find_loop_entry_edge (loop->entry->bb)) == NULL) return;
  if ((bb_insn = DLIST_TAIL (bb_insn_t, e->src->bb_insns)) == NULL || bb_insn->insn->code == MIR_JMP
      || !MIR_any_branch_code_p (bb_insn->insn->code)) {
    loop->u.preheader = e->src->loop_node;      /* The preheader already exists */
    e->src->loop_node->u.preheader_loop = loop; /* The preheader already exists */
  } else {
    create_preheader_from_edge (gen_ctx, e, loop);
  }
}